

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O0

Var __thiscall
Js::DynamicTypeHandler::GetAuxSlot(DynamicTypeHandler *this,DynamicObject *instance,int index)

{
  void *ptr;
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  int iVar4;
  undefined4 *puVar5;
  WriteBarrierPtr<void> **ppWVar6;
  void **ppvVar7;
  Var value;
  int index_local;
  DynamicObject *instance_local;
  DynamicTypeHandler *this_local;
  
  iVar4 = GetSlotCapacity(this);
  uVar3 = GetInlineSlotCapacity(this);
  if ((int)(iVar4 - (uint)uVar3) <= index) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x73,"(index < GetSlotCapacity() - GetInlineSlotCapacity())",
                                "index < GetSlotCapacity() - GetInlineSlotCapacity()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppWVar6 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&instance->auxSlots);
  ppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)(*ppWVar6 + index));
  ptr = *ppvVar7;
  bVar2 = ThreadContext::IsOnStack(instance);
  if (((!bVar2) && (bVar2 = ThreadContext::IsOnStack(ptr), bVar2)) &&
     (bVar2 = TaggedNumber::Is(ptr), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x75,
                                "(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value))"
                                ,
                                "ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  return ptr;
}

Assistant:

Var DynamicTypeHandler::GetAuxSlot(DynamicObject * instance, int index)
    {
        // We should only assign a stack value only to a stack object (current mark temp number in mark temp object)

        Assert(index < GetSlotCapacity() - GetInlineSlotCapacity());
        Var value = instance->auxSlots[index];
        Assert(ThreadContext::IsOnStack(instance) || !ThreadContext::IsOnStack(value) || TaggedNumber::Is(value));
        return value;
    }